

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

bool __thiscall Builder::Build(Builder *this,string *err)

{
  BuildStatus *this_00;
  bool bVar1;
  int total;
  uint uVar2;
  pointer pCVar3;
  DryRunCommandRunner *this_01;
  RealCommandRunner *this_02;
  int local_74;
  undefined1 local_70 [8];
  Result result;
  Edge *edge;
  int local_28;
  int local_24;
  int failures_allowed;
  int pending_commands;
  string *err_local;
  Builder *this_local;
  
  bVar1 = AlreadyUpToDate(this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!AlreadyUpToDate()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build.cc"
                  ,0x325,"bool Builder::Build(string *)");
  }
  this_00 = this->status_;
  total = Plan::command_edge_count(&this->plan_);
  BuildStatus::PlanHasTotalEdges(this_00,total);
  local_24 = 0;
  local_28 = *(int *)(this->config_ + 0xc);
  pCVar3 = std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::get
                     (&this->command_runner_);
  if (pCVar3 == (pointer)0x0) {
    if (((byte)this->config_[4] & 1) == 0) {
      this_02 = (RealCommandRunner *)operator_new(0x2f0);
      RealCommandRunner::RealCommandRunner(this_02,this->config_);
      std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::reset
                (&this->command_runner_,(pointer)this_02);
    }
    else {
      this_01 = (DryRunCommandRunner *)operator_new(0x58);
      anon_unknown.dwarf_29084::DryRunCommandRunner::DryRunCommandRunner(this_01);
      std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::reset
                (&this->command_runner_,(pointer)this_01);
    }
  }
  BuildStatus::BuildStarted(this->status_);
LAB_0010ea6a:
  do {
    bVar1 = Plan::more_to_do(&this->plan_);
    if (!bVar1) {
      BuildStatus::BuildFinished(this->status_);
      this_local._7_1_ = 1;
      goto LAB_0010ed4b;
    }
    if (local_28 != 0) {
      pCVar3 = std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::operator->
                         (&this->command_runner_);
      uVar2 = (*pCVar3->_vptr_CommandRunner[2])();
      if (((uVar2 & 1) != 0) &&
         (result.output.field_2._8_8_ = Plan::FindWork(&this->plan_),
         (Edge *)result.output.field_2._8_8_ != (Edge *)0x0)) {
        bVar1 = StartEdge(this,(Edge *)result.output.field_2._8_8_,err);
        if (!bVar1) {
          Cleanup(this);
          BuildStatus::BuildFinished(this->status_);
          this_local._7_1_ = 0;
          goto LAB_0010ed4b;
        }
        bVar1 = Edge::is_phony((Edge *)result.output.field_2._8_8_);
        if (bVar1) {
          bVar1 = Plan::EdgeFinished(&this->plan_,(Edge *)result.output.field_2._8_8_,kEdgeSucceeded
                                     ,err);
          if (!bVar1) {
            Cleanup(this);
            BuildStatus::BuildFinished(this->status_);
            this_local._7_1_ = 0;
            goto LAB_0010ed4b;
          }
        }
        else {
          local_24 = local_24 + 1;
        }
        goto LAB_0010ea6a;
      }
    }
    if (local_24 == 0) {
      BuildStatus::BuildFinished(this->status_);
      if (local_28 == 0) {
        if (*(int *)(this->config_ + 0xc) < 2) {
          std::__cxx11::string::operator=((string *)err,"subcommand failed");
        }
        else {
          std::__cxx11::string::operator=((string *)err,"subcommands failed");
        }
      }
      else if (local_28 < *(int *)(this->config_ + 0xc)) {
        std::__cxx11::string::operator=((string *)err,"cannot make progress due to previous errors")
        ;
      }
      else {
        std::__cxx11::string::operator=((string *)err,"stuck [this is a bug]");
      }
      this_local._7_1_ = 0;
      goto LAB_0010ed4b;
    }
    CommandRunner::Result::Result((Result *)local_70);
    pCVar3 = std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::operator->
                       (&this->command_runner_);
    uVar2 = (*pCVar3->_vptr_CommandRunner[4])(pCVar3,(Result *)local_70);
    if (((uVar2 & 1) == 0) || ((int)result.edge == 2)) {
      Cleanup(this);
      BuildStatus::BuildFinished(this->status_);
      std::__cxx11::string::operator=((string *)err,"interrupted by user");
      this_local._7_1_ = 0;
      local_74 = 1;
    }
    else {
      local_24 = local_24 + -1;
      bVar1 = FinishCommand(this,(Result *)local_70,err);
      if (bVar1) {
        bVar1 = CommandRunner::Result::success((Result *)local_70);
        if ((!bVar1) && (local_28 != 0)) {
          local_28 = local_28 + -1;
        }
        local_74 = 2;
      }
      else {
        Cleanup(this);
        BuildStatus::BuildFinished(this->status_);
        this_local._7_1_ = 0;
        local_74 = 1;
      }
    }
    CommandRunner::Result::~Result((Result *)local_70);
    if (local_74 == 1) {
LAB_0010ed4b:
      return (bool)(this_local._7_1_ & 1);
    }
  } while( true );
}

Assistant:

bool Builder::Build(string* err) {
  assert(!AlreadyUpToDate());

  status_->PlanHasTotalEdges(plan_.command_edge_count());
  int pending_commands = 0;
  int failures_allowed = config_.failures_allowed;

  // Set up the command runner if we haven't done so already.
  if (!command_runner_.get()) {
    if (config_.dry_run)
      command_runner_.reset(new DryRunCommandRunner);
    else
      command_runner_.reset(new RealCommandRunner(config_));
  }

  // We are about to start the build process.
  status_->BuildStarted();

  // This main loop runs the entire build process.
  // It is structured like this:
  // First, we attempt to start as many commands as allowed by the
  // command runner.
  // Second, we attempt to wait for / reap the next finished command.
  while (plan_.more_to_do()) {
    // See if we can start any more commands.
    if (failures_allowed && command_runner_->CanRunMore()) {
      if (Edge* edge = plan_.FindWork()) {
        if (!StartEdge(edge, err)) {
          Cleanup();
          status_->BuildFinished();
          return false;
        }

        if (edge->is_phony()) {
          if (!plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, err)) {
            Cleanup();
            status_->BuildFinished();
            return false;
          }
        } else {
          ++pending_commands;
        }

        // We made some progress; go back to the main loop.
        continue;
      }
    }

    // See if we can reap any finished commands.
    if (pending_commands) {
      CommandRunner::Result result;
      if (!command_runner_->WaitForCommand(&result) ||
          result.status == ExitInterrupted) {
        Cleanup();
        status_->BuildFinished();
        *err = "interrupted by user";
        return false;
      }

      --pending_commands;
      if (!FinishCommand(&result, err)) {
        Cleanup();
        status_->BuildFinished();
        return false;
      }

      if (!result.success()) {
        if (failures_allowed)
          failures_allowed--;
      }

      // We made some progress; start the main loop over.
      continue;
    }

    // If we get here, we cannot make any more progress.
    status_->BuildFinished();
    if (failures_allowed == 0) {
      if (config_.failures_allowed > 1)
        *err = "subcommands failed";
      else
        *err = "subcommand failed";
    } else if (failures_allowed < config_.failures_allowed)
      *err = "cannot make progress due to previous errors";
    else
      *err = "stuck [this is a bug]";

    return false;
  }

  status_->BuildFinished();
  return true;
}